

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  string *pass_00;
  int iVar2;
  int iVar3;
  _Ios_Openmode _Var4;
  Game *pGVar5;
  Net *this;
  ostream *poVar6;
  __tuple_element_t<0UL,_tuple<int,_int>_> *p_Var7;
  __tuple_element_t<1UL,_tuple<int,_int>_> *p_Var8;
  pointer pGVar9;
  pointer pNVar10;
  __tuple_element_t<0UL,_tuple<basic_string<char>,_int,_int>_> *p_Var11;
  long lVar12;
  __tuple_element_t<1UL,_tuple<basic_string<char>,_int,_int>_> *p_Var13;
  __tuple_element_t<2UL,_tuple<basic_string<char>,_int,_int>_> *p_Var14;
  undefined8 uVar15;
  invalid_argument *piVar16;
  bool bVar17;
  invalid_argument *e_1;
  stringstream stream;
  undefined1 local_2b0 [8];
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
  action;
  string input;
  __cxx11 local_268 [38];
  dialogbox local_242;
  Graphic local_241 [7];
  dialogbox dialog;
  Graphic graphic;
  invalid_argument *e;
  tuple<int,_int> local_230;
  tuple<int,_int> size_1;
  string local_220 [32];
  undefined1 local_200 [40];
  tuple<int,_int> local_1d8;
  tuple<int,_int> size;
  string local_1b0 [32];
  int local_190;
  int local_18c;
  int y_2;
  int x_2;
  string sy_1;
  string local_168 [8];
  string sx_1;
  string local_140 [32];
  string local_120 [32];
  int local_100;
  int local_fc;
  int y_1;
  int x_1;
  string sy;
  string local_d8 [8];
  string sx;
  unique_ptr<Net,_std::default_delete<Net>_> local_a8;
  unique_ptr<Net,_std::default_delete<Net>_> net;
  unique_ptr<Game,_std::default_delete<Game>_> game;
  int freeput;
  int netret;
  int netmode;
  int mode;
  int y;
  int x;
  longlong room;
  string arg;
  string local_58 [8];
  string pass;
  string local_38 [8];
  string ip;
  char **argv_local;
  int argc_local;
  
  std::__cxx11::string::string(local_38);
  std::__cxx11::string::string(local_58);
  std::__cxx11::string::string((string *)&room);
  freeput = -1;
  game._M_t.super___uniq_ptr_impl<Game,_std::default_delete<Game>_>._M_t.
  super__Tuple_impl<0UL,_Game_*,_std::default_delete<Game>_>.super__Head_base<0UL,_Game_*,_false>.
  _M_head_impl._0_4_ = 0;
  std::unique_ptr<Game,std::default_delete<Game>>::unique_ptr<std::default_delete<Game>,void>
            ((unique_ptr<Game,std::default_delete<Game>> *)&net);
  std::unique_ptr<Net,std::default_delete<Net>>::unique_ptr<std::default_delete<Net>,void>
            ((unique_ptr<Net,std::default_delete<Net>> *)&local_a8);
  iVar2 = intGetOption(anon_var_dwarf_cf5b);
  if (iVar2 == 0) {
    iVar3 = intGetOption(anon_var_dwarf_cf7e);
    if (iVar3 == 0) {
      pGVar5 = (Game *)operator_new(0x20);
      Game::Game(pGVar5);
      std::unique_ptr<Game,_std::default_delete<Game>_>::reset
                ((unique_ptr<Game,_std::default_delete<Game>_> *)&net,pGVar5);
    }
    else {
      std::__cxx11::string::string(local_d8);
      std::__cxx11::string::string((string *)&y_1);
      local_fc = intGetOption(anon_var_dwarf_cf94);
      local_100 = intGetOption(anon_var_dwarf_cfaa);
      if ((8 < local_fc) || (8 < local_100)) {
        piVar16 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar16,"");
        __cxa_throw(piVar16,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      pGVar5 = (Game *)operator_new(0x20);
      Game::Game(pGVar5,local_fc,local_100);
      std::unique_ptr<Game,_std::default_delete<Game>_>::reset
                ((unique_ptr<Game,_std::default_delete<Game>_> *)&net,pGVar5);
      std::__cxx11::string::~string((string *)&y_1);
      std::__cxx11::string::~string(local_d8);
    }
  }
  else {
    if (iVar2 != 1) {
      piVar16 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar16,"");
      __cxa_throw(piVar16,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    this = (Net *)operator_new(0x18);
    Net::Net(this);
    std::unique_ptr<Net,_std::default_delete<Net>_>::reset(&local_a8,this);
    strGetOption_abi_cxx11_((char *)local_120);
    std::__cxx11::string::operator=(local_38,local_120);
    std::__cxx11::string::~string(local_120);
    pNVar10 = std::unique_ptr<Net,_std::default_delete<Net>_>::operator->(&local_a8);
    std::__cxx11::string::string(local_140,local_38);
    iVar3 = Net::makeconnect(pNVar10,(string *)local_140);
    std::__cxx11::string::~string(local_140);
    if (iVar3 != 0) {
      poVar6 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_cfe0);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = 1;
      goto LAB_00111f14;
    }
    iVar3 = intGetOption(anon_var_dwarf_cff6);
    if (iVar3 == 0) {
      freeput = -1;
      iVar3 = intGetOption(anon_var_dwarf_cf7e);
      if (iVar3 == 0) {
        pGVar5 = (Game *)operator_new(0x20);
        Game::Game(pGVar5);
        std::unique_ptr<Game,_std::default_delete<Game>_>::reset
                  ((unique_ptr<Game,_std::default_delete<Game>_> *)&net,pGVar5);
      }
      else {
        std::__cxx11::string::string(local_168);
        std::__cxx11::string::string((string *)&y_2);
        local_18c = intGetOption(anon_var_dwarf_cf94);
        local_190 = intGetOption(anon_var_dwarf_cfaa);
        if ((8 < local_18c) || (8 < local_190)) {
          piVar16 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar16,"");
          __cxa_throw(piVar16,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        pGVar5 = (Game *)operator_new(0x20);
        Game::Game(pGVar5,local_18c,local_190);
        std::unique_ptr<Game,_std::default_delete<Game>_>::reset
                  ((unique_ptr<Game,_std::default_delete<Game>_> *)&net,pGVar5);
        std::__cxx11::string::~string((string *)&y_2);
        std::__cxx11::string::~string(local_168);
      }
      poVar6 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_d00c);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      std::operator<<(poVar6,anon_var_dwarf_d022);
      std::operator>>((istream *)&std::cin,(string *)&room);
      iVar3 = std::__cxx11::string::compare((char *)&room);
      if (iVar3 == 0) {
        strGetOption_abi_cxx11_((char *)local_1b0);
        std::__cxx11::string::operator=(local_58,local_1b0);
        std::__cxx11::string::~string(local_1b0);
        pNVar10 = std::unique_ptr<Net,_std::default_delete<Net>_>::operator->(&local_a8);
        pGVar9 = std::unique_ptr<Game,_std::default_delete<Game>_>::operator->
                           ((unique_ptr<Game,_std::default_delete<Game>_> *)&net);
        iVar3 = pGVar9->board->boardx;
        pGVar9 = std::unique_ptr<Game,_std::default_delete<Game>_>::operator->
                           ((unique_ptr<Game,_std::default_delete<Game>_> *)&net);
        iVar1 = pGVar9->board->boardy;
        std::__cxx11::string::string((string *)&size,local_58);
        _y = (string *)Net::makeroom(pNVar10,iVar3 / 2,iVar1 / 2,(string *)&size);
        std::__cxx11::string::~string((string *)&size);
      }
      else {
        pNVar10 = std::unique_ptr<Net,_std::default_delete<Net>_>::operator->(&local_a8);
        pGVar9 = std::unique_ptr<Game,_std::default_delete<Game>_>::operator->
                           ((unique_ptr<Game,_std::default_delete<Game>_> *)&net);
        iVar3 = pGVar9->board->boardx;
        pGVar9 = std::unique_ptr<Game,_std::default_delete<Game>_>::operator->
                           ((unique_ptr<Game,_std::default_delete<Game>_> *)&net);
        _y = (string *)Net::makeroom(pNVar10,iVar3 / 2,pGVar9->board->boardy / 2);
      }
      poVar6 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_d064);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::hex);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,(longlong)_y);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::dec);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    else if (iVar3 == 1) {
      freeput = 1;
      std::tuple<int,_int>::tuple<true,_true>(&local_1d8);
      std::ios_base::setf((ios_base *)((long)&std::cin + *(long *)(std::cin + -0x18)),_S_hex,
                          _S_basefield);
      _y = (string *)llGetOption(anon_var_dwarf_d07a);
      std::ios_base::setf((ios_base *)((long)&std::cin + *(long *)(std::cin + -0x18)),_S_dec,
                          _S_basefield);
      poVar6 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_d090);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      std::operator<<(poVar6,anon_var_dwarf_d0a6);
      std::operator>>((istream *)&std::cin,(string *)&room);
      iVar3 = std::__cxx11::string::compare((char *)&room);
      if ((iVar3 != 0) && (iVar3 = std::__cxx11::string::compare((char *)&room), iVar3 != 0)) {
        piVar16 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar16,"");
        __cxa_throw(piVar16,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      iVar3 = std::__cxx11::string::compare((char *)&room);
      if (iVar3 == 0) {
        strGetOption_abi_cxx11_(local_200 + 8);
        std::__cxx11::string::operator=(local_58,(string *)(local_200 + 8));
        std::__cxx11::string::~string((string *)(local_200 + 8));
        pNVar10 = std::unique_ptr<Net,_std::default_delete<Net>_>::operator->(&local_a8);
        pass_00 = _y;
        std::__cxx11::string::string(local_220,local_58);
        Net::login((Net *)local_200,(longlong)pNVar10,pass_00);
        std::tuple<int,_int>::operator=(&local_1d8,(type)local_200);
        std::__cxx11::string::~string(local_220);
      }
      else {
        pNVar10 = std::unique_ptr<Net,_std::default_delete<Net>_>::operator->(&local_a8);
        Net::login((Net *)&size_1,(longlong)pNVar10);
        std::tuple<int,_int>::operator=(&local_1d8,&size_1);
      }
      p_Var7 = std::get<0ul,int,int>(&local_1d8);
      if (*p_Var7 == -1) {
        poVar6 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_cfe0);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        argv_local._4_4_ = 1;
        goto LAB_00111f14;
      }
      pGVar5 = (Game *)operator_new(0x20);
      p_Var7 = std::get<0ul,int,int>(&local_1d8);
      iVar3 = *p_Var7;
      p_Var8 = std::get<1ul,int,int>(&local_1d8);
      Game::Game(pGVar5,iVar3,*p_Var8);
      std::unique_ptr<Game,_std::default_delete<Game>_>::reset
                ((unique_ptr<Game,_std::default_delete<Game>_> *)&net,pGVar5);
    }
    else {
      if (iVar3 != 2) {
        piVar16 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar16,"");
        __cxa_throw(piVar16,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      pNVar10 = std::unique_ptr<Net,_std::default_delete<Net>_>::operator->(&local_a8);
      _y = (string *)Net::automatch(pNVar10);
      if (_y == (string *)0x0) {
        freeput = -1;
        pGVar5 = (Game *)operator_new(0x20);
        Game::Game(pGVar5);
        std::unique_ptr<Game,_std::default_delete<Game>_>::reset
                  ((unique_ptr<Game,_std::default_delete<Game>_> *)&net,pGVar5);
        pNVar10 = std::unique_ptr<Net,_std::default_delete<Net>_>::operator->(&local_a8);
        pGVar9 = std::unique_ptr<Game,_std::default_delete<Game>_>::operator->
                           ((unique_ptr<Game,_std::default_delete<Game>_> *)&net);
        iVar3 = pGVar9->board->boardx;
        pGVar9 = std::unique_ptr<Game,_std::default_delete<Game>_>::operator->
                           ((unique_ptr<Game,_std::default_delete<Game>_> *)&net);
        Net::makeroom(pNVar10,iVar3 / 2,pGVar9->board->boardy / 2);
      }
      else {
        freeput = 2;
        if (_y != (string *)0xffffffffffffffff) {
          freeput = 1;
          std::tuple<int,_int>::tuple<true,_true>(&local_230);
          pNVar10 = std::unique_ptr<Net,_std::default_delete<Net>_>::operator->(&local_a8);
          Net::login((Net *)&e,(longlong)pNVar10);
          std::tuple<int,_int>::operator=(&local_230,(type)&e);
          p_Var7 = std::get<0ul,int,int>(&local_230);
          if (*p_Var7 == -1) {
            poVar6 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_cfe0);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            argv_local._4_4_ = 1;
            goto LAB_00111f14;
          }
          pGVar5 = (Game *)operator_new(0x20);
          p_Var7 = std::get<0ul,int,int>(&local_230);
          iVar3 = *p_Var7;
          p_Var8 = std::get<1ul,int,int>(&local_230);
          Game::Game(pGVar5,iVar3,*p_Var8);
          std::unique_ptr<Game,_std::default_delete<Game>_>::reset
                    ((unique_ptr<Game,_std::default_delete<Game>_> *)&net,pGVar5);
        }
      }
    }
  }
  Graphic::Graphic(local_241);
  dialogbox::dialogbox(&local_242);
  Graphic::StartGame(local_241);
  pGVar9 = std::unique_ptr<Game,_std::default_delete<Game>_>::operator->
                     ((unique_ptr<Game,_std::default_delete<Game>_> *)&net);
  Graphic::Put(local_241,&pGVar9->board->delta);
  if (iVar2 == 1) {
    pGVar9 = std::unique_ptr<Game,_std::default_delete<Game>_>::operator->
                       ((unique_ptr<Game,_std::default_delete<Game>_> *)&net);
    Graphic::netchangeturn(local_241,pGVar9->turn,freeput);
    if (freeput == -1) {
      std::__cxx11::to_string(local_268,(longlong)_y);
      Graphic::netwait(local_241,(string *)local_268);
      std::__cxx11::string::~string((string *)local_268);
    }
  }
  else {
    pGVar9 = std::unique_ptr<Game,_std::default_delete<Game>_>::operator->
                       ((unique_ptr<Game,_std::default_delete<Game>_> *)&net);
    Graphic::changeturn(local_241,pGVar9->turn);
  }
  std::__cxx11::string::string
            ((string *)
             &action.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
              .field_0x18);
LAB_001115cf:
  do {
    if (((iVar2 == 1) &&
        (pNVar10 = std::unique_ptr<Net,_std::default_delete<Net>_>::operator->(&local_a8),
        pNVar10->closed == 0)) &&
       ((pGVar9 = std::unique_ptr<Game,_std::default_delete<Game>_>::operator->
                            ((unique_ptr<Game,_std::default_delete<Game>_> *)&net),
        freeput != pGVar9->turn ||
        (pNVar10 = std::unique_ptr<Net,_std::default_delete<Net>_>::operator->(&local_a8),
        pNVar10->ready == 0)))) {
      pNVar10 = std::unique_ptr<Net,_std::default_delete<Net>_>::operator->(&local_a8);
      Net::get_abi_cxx11_((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                           *)local_2b0,pNVar10);
      p_Var11 = std::get<0ul,std::__cxx11::string,int,int>
                          ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                            *)local_2b0);
      lVar12 = std::__cxx11::string::find((char *)p_Var11,0x1175b4);
      if (lVar12 == -1) {
        p_Var11 = std::get<0ul,std::__cxx11::string,int,int>
                            ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                              *)local_2b0);
        lVar12 = std::__cxx11::string::find((char *)p_Var11,0x1175bb);
        if (lVar12 != -1) goto LAB_00111696;
        p_Var11 = std::get<0ul,std::__cxx11::string,int,int>
                            ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                              *)local_2b0);
        lVar12 = std::__cxx11::string::find((char *)p_Var11,0x1175c1);
        if ((lVar12 != -1) &&
           (pGVar9 = std::unique_ptr<Game,_std::default_delete<Game>_>::operator->
                               ((unique_ptr<Game,_std::default_delete<Game>_> *)&net),
           freeput != pGVar9->turn)) {
          pGVar9 = std::unique_ptr<Game,_std::default_delete<Game>_>::operator->
                             ((unique_ptr<Game,_std::default_delete<Game>_> *)&net);
          p_Var13 = std::get<1ul,std::__cxx11::string,int,int>
                              ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                                *)local_2b0);
          iVar3 = *p_Var13;
          p_Var14 = std::get<2ul,std::__cxx11::string,int,int>
                              ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                                *)local_2b0);
          Game::put(pGVar9,iVar3,*p_Var14,
                    (uint)game._M_t.super___uniq_ptr_impl<Game,_std::default_delete<Game>_>._M_t.
                          super__Tuple_impl<0UL,_Game_*,_std::default_delete<Game>_>.
                          super__Head_base<0UL,_Game_*,_false>._M_head_impl);
          pGVar9 = std::unique_ptr<Game,_std::default_delete<Game>_>::operator->
                             ((unique_ptr<Game,_std::default_delete<Game>_> *)&net);
          Graphic::Put(local_241,&pGVar9->board->delta);
          pGVar9 = std::unique_ptr<Game,_std::default_delete<Game>_>::operator->
                             ((unique_ptr<Game,_std::default_delete<Game>_> *)&net);
          Graphic::netchangeturn(local_241,pGVar9->turn,freeput);
          goto LAB_0011193a;
        }
        p_Var11 = std::get<0ul,std::__cxx11::string,int,int>
                            ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                              *)local_2b0);
        lVar12 = std::__cxx11::string::find((char *)p_Var11,0x1175c5);
        if ((lVar12 != -1) &&
           (pGVar9 = std::unique_ptr<Game,_std::default_delete<Game>_>::operator->
                               ((unique_ptr<Game,_std::default_delete<Game>_> *)&net),
           freeput != pGVar9->turn)) {
          pGVar9 = std::unique_ptr<Game,_std::default_delete<Game>_>::operator->
                             ((unique_ptr<Game,_std::default_delete<Game>_> *)&net);
          p_Var13 = std::get<1ul,std::__cxx11::string,int,int>
                              ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                                *)local_2b0);
          iVar3 = *p_Var13;
          p_Var14 = std::get<2ul,std::__cxx11::string,int,int>
                              ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                                *)local_2b0);
          Game::put(pGVar9,iVar3,*p_Var14);
          pGVar9 = std::unique_ptr<Game,_std::default_delete<Game>_>::operator->
                             ((unique_ptr<Game,_std::default_delete<Game>_> *)&net);
          Graphic::Put(local_241,&pGVar9->board->delta);
          pGVar9 = std::unique_ptr<Game,_std::default_delete<Game>_>::operator->
                             ((unique_ptr<Game,_std::default_delete<Game>_> *)&net);
          Graphic::netchangeturn(local_241,pGVar9->turn,freeput);
          goto LAB_0011193a;
        }
        p_Var11 = std::get<0ul,std::__cxx11::string,int,int>
                            ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                              *)local_2b0);
        lVar12 = std::__cxx11::string::find((char *)p_Var11,0x1175c9);
        if (lVar12 == -1) goto LAB_0011193a;
        pGVar9 = std::unique_ptr<Game,_std::default_delete<Game>_>::operator->
                           ((unique_ptr<Game,_std::default_delete<Game>_> *)&net);
        Graphic::netchangeturn(local_241,pGVar9->turn,freeput);
        pNVar10 = std::unique_ptr<Net,_std::default_delete<Net>_>::operator->(&local_a8);
        pNVar10->started = 1;
        pNVar10 = std::unique_ptr<Net,_std::default_delete<Net>_>::operator->(&local_a8);
        pNVar10->ready = 1;
        bVar17 = true;
      }
      else {
LAB_00111696:
        pNVar10 = std::unique_ptr<Net,_std::default_delete<Net>_>::operator->(&local_a8);
        pNVar10->closed = 1;
LAB_0011193a:
        bVar17 = false;
      }
      std::
      tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
      ::~tuple((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                *)local_2b0);
      if (bVar17) goto LAB_001115cf;
    }
    while( true ) {
      bVar17 = true;
      if (iVar2 != 0) {
        pNVar10 = std::unique_ptr<Net,_std::default_delete<Net>_>::operator->(&local_a8);
        bVar17 = pNVar10->closed == 0;
      }
      if (!bVar17) goto LAB_00111bb0;
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,
                 (string *)
                 &action.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                  .field_0x18);
      iVar3 = std::__cxx11::string::compare
                        (&action.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                          .field_0x18);
      if (iVar3 != 0) break;
      game._M_t.super___uniq_ptr_impl<Game,_std::default_delete<Game>_>._M_t.
      super__Tuple_impl<0UL,_Game_*,_std::default_delete<Game>_>.
      super__Head_base<0UL,_Game_*,_false>._M_head_impl._0_4_ =
           (uint)((uint)game._M_t.super___uniq_ptr_impl<Game,_std::default_delete<Game>_>._M_t.
                        super__Tuple_impl<0UL,_Game_*,_std::default_delete<Game>_>.
                        super__Head_base<0UL,_Game_*,_false>._M_head_impl == 0);
      std::operator<<((ostream *)&std::cout,"\x1b[2;42H\x1b[0K");
    }
    iVar3 = std::__cxx11::string::compare
                      (&action.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                        .field_0x18);
    if (iVar3 == 0) {
      pNVar10 = std::unique_ptr<Net,_std::default_delete<Net>_>::operator->(&local_a8);
      Net::closing(pNVar10);
    }
    else {
      _Var4 = std::operator|(_S_out,_S_in);
      std::__cxx11::stringstream::stringstream
                ((stringstream *)&e_1,
                 (string *)
                 &action.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                  .field_0x18,_Var4);
      uVar15 = std::__cxx11::string::c_str();
      iVar3 = __isoc99_sscanf(uVar15,"%x %x",&mode,&netmode);
      if (((iVar3 < 2) || (0xf < mode)) || (0xf < netmode)) {
        piVar16 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar16,"");
        __cxa_throw(piVar16,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&e_1);
    }
LAB_00111bb0:
    if ((iVar2 == 0) ||
       ((pGVar9 = std::unique_ptr<Game,_std::default_delete<Game>_>::operator->
                            ((unique_ptr<Game,_std::default_delete<Game>_> *)&net),
        freeput == pGVar9->turn &&
        (pNVar10 = std::unique_ptr<Net,_std::default_delete<Net>_>::operator->(&local_a8),
        pNVar10->ready != 0)))) {
      if ((uint)game._M_t.super___uniq_ptr_impl<Game,_std::default_delete<Game>_>._M_t.
                super__Tuple_impl<0UL,_Game_*,_std::default_delete<Game>_>.
                super__Head_base<0UL,_Game_*,_false>._M_head_impl == 0) {
        pGVar9 = std::unique_ptr<Game,_std::default_delete<Game>_>::operator->
                           ((unique_ptr<Game,_std::default_delete<Game>_> *)&net);
        bVar17 = Game::put(pGVar9,mode,netmode);
        if (bVar17) {
          if (iVar2 == 1) {
            pNVar10 = std::unique_ptr<Net,_std::default_delete<Net>_>::operator->(&local_a8);
            Net::put(pNVar10,mode,netmode);
          }
          pGVar9 = std::unique_ptr<Game,_std::default_delete<Game>_>::operator->
                             ((unique_ptr<Game,_std::default_delete<Game>_> *)&net);
          Graphic::Put(local_241,&pGVar9->board->delta);
          if (iVar2 == 1) {
            pGVar9 = std::unique_ptr<Game,_std::default_delete<Game>_>::operator->
                               ((unique_ptr<Game,_std::default_delete<Game>_> *)&net);
            Graphic::netchangeturn(local_241,pGVar9->turn,freeput);
          }
          else {
            pGVar9 = std::unique_ptr<Game,_std::default_delete<Game>_>::operator->
                               ((unique_ptr<Game,_std::default_delete<Game>_> *)&net);
            Graphic::changeturn(local_241,pGVar9->turn);
          }
        }
        else {
          std::operator<<((ostream *)&std::cout,"\x1b[2;42H\x1b[0K");
        }
      }
      else {
        pGVar9 = std::unique_ptr<Game,_std::default_delete<Game>_>::operator->
                           ((unique_ptr<Game,_std::default_delete<Game>_> *)&net);
        bVar17 = Game::put(pGVar9,mode,netmode,
                           (uint)game._M_t.super___uniq_ptr_impl<Game,_std::default_delete<Game>_>.
                                 _M_t.super__Tuple_impl<0UL,_Game_*,_std::default_delete<Game>_>.
                                 super__Head_base<0UL,_Game_*,_false>._M_head_impl);
        if (bVar17) {
          if (iVar2 == 1) {
            pNVar10 = std::unique_ptr<Net,_std::default_delete<Net>_>::operator->(&local_a8);
            Net::freeput(pNVar10,mode,netmode);
          }
          pGVar9 = std::unique_ptr<Game,_std::default_delete<Game>_>::operator->
                             ((unique_ptr<Game,_std::default_delete<Game>_> *)&net);
          Graphic::Put(local_241,&pGVar9->board->delta);
          if (iVar2 == 1) {
            pGVar9 = std::unique_ptr<Game,_std::default_delete<Game>_>::operator->
                               ((unique_ptr<Game,_std::default_delete<Game>_> *)&net);
            Graphic::netchangeturn(local_241,pGVar9->turn,freeput);
          }
          else {
            pGVar9 = std::unique_ptr<Game,_std::default_delete<Game>_>::operator->
                               ((unique_ptr<Game,_std::default_delete<Game>_> *)&net);
            Graphic::changeturn(local_241,pGVar9->turn);
          }
        }
        else {
          std::operator<<((ostream *)&std::cout,"\x1b[2;42H\x1b[0K");
        }
      }
      pGVar9 = std::unique_ptr<Game,_std::default_delete<Game>_>::operator->
                         ((unique_ptr<Game,_std::default_delete<Game>_> *)&net);
      if ((pGVar9->full & 1U) != 0) {
        pGVar9 = std::unique_ptr<Game,_std::default_delete<Game>_>::operator->
                           ((unique_ptr<Game,_std::default_delete<Game>_> *)&net);
        iVar3 = pGVar9->b;
        pGVar9 = std::unique_ptr<Game,_std::default_delete<Game>_>::operator->
                           ((unique_ptr<Game,_std::default_delete<Game>_> *)&net);
        iVar1 = pGVar9->w;
        pGVar9 = std::unique_ptr<Game,_std::default_delete<Game>_>::operator->
                           ((unique_ptr<Game,_std::default_delete<Game>_> *)&net);
        dialogbox::EndGameDialogBox(&local_242,iVar3,iVar1,pGVar9->howturn);
        Graphic::end(local_241);
        pGVar9 = std::unique_ptr<Game,_std::default_delete<Game>_>::operator->
                           ((unique_ptr<Game,_std::default_delete<Game>_> *)&net);
        pGVar9->full = false;
      }
    }
  } while (((iVar2 != 1) ||
           (pNVar10 = std::unique_ptr<Net,_std::default_delete<Net>_>::operator->(&local_a8),
           pNVar10->closed != 1)) ||
          (pNVar10 = std::unique_ptr<Net,_std::default_delete<Net>_>::operator->(&local_a8),
          pNVar10->ready != 1));
  dialogbox::ConnectionclosedDialogBox(&local_242);
  Graphic::end(local_241);
  pNVar10 = std::unique_ptr<Net,_std::default_delete<Net>_>::operator->(&local_a8);
  pNVar10->ready = 0;
  argv_local._4_4_ = 0;
  std::__cxx11::string::~string
            ((string *)
             &action.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
              .field_0x18);
  dialogbox::~dialogbox(&local_242);
  Graphic::~Graphic(local_241);
LAB_00111f14:
  std::unique_ptr<Net,_std::default_delete<Net>_>::~unique_ptr(&local_a8);
  std::unique_ptr<Game,_std::default_delete<Game>_>::~unique_ptr
            ((unique_ptr<Game,_std::default_delete<Game>_> *)&net);
  std::__cxx11::string::~string((string *)&room);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]){
	std::string ip, pass, arg;
	long long room;
	int x, y, mode = -1, netmode = -1, netret, freeput = 0;
	std::unique_ptr<Game> game;
	std::unique_ptr<Net> net;
	try{
		mode=intGetOption("モードを選択してください\n0:オフラインで交互にプレイする 1:オンラインでプレイする場合 :");
		if(mode==0){//offline
			if(intGetOption("盤面サイズを指定しますか?\n0:指定しない 1:指定する :")==0) game.reset(new Game());
			else{
				std::string sx,sy;
				int x,y;
				x=intGetOption("8以下で縦のサイズを入力してください(盤面は入力された数値の倍のサイズになります):");
				y=intGetOption("8以下で横のサイズを入力してください(盤面は入力された数値の倍のサイズになります):");
				if(x>8||y>8)throw std::invalid_argument("");
				game.reset(new Game(x,y));
			}
		} else if(mode==1){//online
			net.reset(new Net());
			ip=strGetOption("サーバーのIPアドレスまたはドメインを入力してください:");
			netret=net->makeconnect(ip);
			if(netret){
				std::cout<<"通信エラー:終了します"<<std::endl;
				return 1;
			}
			netmode=intGetOption("モードを選択してください\n0:ホストとして部屋を立てる 1:ゲストとして部屋に入る 2:オートマッチング :");
			if(netmode==0){//host
				netmode=-1;
				if(netret==-1){
					std::cout<<"通信エラー:終了します"<<std::endl;
					return 1;
				}
				if(intGetOption("盤面サイズを指定しますか?\n0:指定しない 1:指定する :")==0){
					game.reset(new Game());
				} else{
					std::string sx,sy;
					int x,y;
					x=intGetOption("8以下で縦のサイズを入力してください(盤面は入力された数値の倍のサイズになります):");
					y=intGetOption("8以下で横のサイズを入力してください(盤面は入力された数値の倍のサイズになります):");
					if(x>8||y>8)throw std::invalid_argument("");
					game.reset(new Game(x,y));
				}
				std::cout<<"パスワードを設定しますか?"<<std::endl<<"0:設定しない 1:設定する :";
				std::cin>>arg;
				if(!arg.compare("1")){
					pass=strGetOption("パスワードを入力してください:");
					room=net->makeroom(game->board->boardx/2,game->board->boardy/2,pass);
				} else 	room=net->makeroom(game->board->boardx/2,game->board->boardy/2);
				std::cout<<"部屋番号:"<<std::hex<<room<<std::dec<<std::endl;
			} else if(netmode==1){//guest
				netmode=1;
				std::tuple<int,int> size;
				std::cin.setf(std::ios::hex,std::ios::basefield);
				room=llGetOption("部屋番号を入力してください:");
				std::cin.setf(std::ios::dec,std::ios::basefield);
				std::cout<<"パスワードが設定されていますか?"<<std::endl<<"0:設定されていない 1:設定されている :";
				std::cin>>arg;
				if(arg.compare("0")&&arg.compare("1"))throw std::invalid_argument("");
				else if(!arg.compare("1")){
					pass=strGetOption("パスワードを入力してください:");
					size=net->login(room,pass);
				} else{
					size=net->login(room);
				}
				if(std::get<0>(size)==-1){
					std::cout<<"通信エラー:終了します"<<std::endl;
					return 1;
				}
				game.reset(new Game(std::get<0>(size),std::get<1>(size)));
			} else if(netmode==2){//automatch
				room=net->automatch();
				if(room==0){
					netmode=-1;
					game.reset(new Game());
					net->makeroom(game->board->boardx/2,game->board->boardy/2);
				} else if(room!=-1){
					netmode=1;
					std::tuple<int,int> size;
					size=net->login(room);
					if(std::get<0>(size)==-1){
						std::cout<<"通信エラー:終了します"<<std::endl;
						return 1;
					}
					game.reset(new Game(std::get<0>(size),std::get<1>(size)));
				}
			} else throw std::invalid_argument("");
		} else  throw std::invalid_argument("");
	} catch(const std::invalid_argument &e){
		std::cout<<"入力が不正です:終了します";
		return 1;
	}
	Graphic graphic;
	dialogbox dialog;

	graphic.StartGame();
	graphic.Put(game->board->delta);
	if(mode==1){
		graphic.netchangeturn(game->turn,netmode);
		if(netmode==-1)graphic.netwait(std::to_string(room));
	}else graphic.changeturn(game->turn);
	std::string input;
	while(true){
		if(mode==1&&net->closed == 0&&(netmode!=game->turn||!net->ready)){
			std::tuple<std::string, int, int> action = net->get();
			if(std::get<0>(action).find("nodata")!=std::string::npos || std::get<0>(action).find("CLOSE")!=std::string::npos){
				net->closed = 1;
			} else if(std::get<0>(action).find("FREEPUT")!=std::string::npos && netmode != game->turn){
				game->put(std::get<1>(action), std::get<2>(action), freeput);
				graphic.Put(game->board->delta);
				graphic.netchangeturn(game->turn,netmode);
			} else if(std::get<0>(action).find("PUT")!=std::string::npos && netmode != game->turn){
				game->put(std::get<1>(action), std::get<2>(action));
				graphic.Put(game->board->delta);
				graphic.netchangeturn(game->turn,netmode);
			} else if(std::get<0>(action).find("READY")!=std::string::npos){
				graphic.netchangeturn(game->turn,netmode);
				net->started = 1;
				net->ready = 1;
				continue;
			}
		}
		while(mode==0||net->closed==0){
			std::getline(std::cin,input);
			if(!input.compare("free")){
				freeput=!freeput;
				std::cout<<"\e[2;42H\e[0K";
				continue;
			}else if(!input.compare("end")){
				net->closing();
				break;
			}
			try{
				std::stringstream stream(input);
				if(sscanf(input.c_str(),"%x %x",&x,&y)<2||x>15||y>15)throw std::invalid_argument("");
				break;
			}catch(const std::invalid_argument& e){
				std::cout<<"\e[2;42H\e[0K";
			}
		}
		if(mode == 0 || (netmode == game->turn&&net->ready)){
			if(freeput == 0){
				if(game->put(x, y)){
					if(mode == 1)net->put(x, y);
					graphic.Put(game->board->delta);
					if(mode == 1)graphic.netchangeturn(game->turn,netmode);
					else graphic.changeturn(game->turn);
				}else{
					std::cout<<"\e[2;42H\e[0K";
				}
			} else {
				if(game->put(x, y, freeput)){
					if(mode == 1)net->freeput(x, y);
					graphic.Put(game->board->delta);
					if(mode == 1)graphic.netchangeturn(game->turn,netmode);
					else graphic.changeturn(game->turn);
				}else{
					std::cout<<"\e[2;42H\e[0K";
				}
			}
			if(game->full){
				dialog.EndGameDialogBox(game->b, game->w, game->howturn);
				graphic.end();
				game->full = false;
			}
		}
			if(mode == 1 && net->closed == 1 && net->ready == 1){
				dialog.ConnectionclosedDialogBox();
				graphic.end();
				net->ready=0;
				break;
			}
	}
	return 0;
}